

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_index.cpp
# Opt level: O0

region_ptr __thiscall
cornelich::vanilla_index::index_for
          (vanilla_index *this,int32_t cycle,int32_t file_number,bool append)

{
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  long lVar1;
  byte in_R8B;
  region_ptr rVar2;
  anon_class_16_2_34bf9f15 local_68;
  byte local_58;
  bool *local_50;
  anon_class_16_2_34bf9f15 *creator;
  pair<int,_int> local_38;
  pair<int,_int> key;
  lock_guard<cornelich::util::spin_lock> lk;
  int local_20;
  int32_t iStack_1c;
  bool append_local;
  int32_t file_number_local;
  int32_t cycle_local;
  vanilla_index *this_local;
  
  lVar1 = CONCAT44(in_register_00000034,cycle);
  local_20 = (int)CONCAT71(in_register_00000009,append);
  iStack_1c = file_number;
  _file_number_local = lVar1;
  this_local = this;
  std::lock_guard<cornelich::util::spin_lock>::lock_guard
            ((lock_guard<cornelich::util::spin_lock> *)&key,(mutex_type *)(lVar1 + 0xc));
  local_38 = std::make_pair<int&,int&>(&stack0xffffffffffffffe4,&local_20);
  local_50 = &local_68.append;
  local_68._8_8_ = lVar1;
  local_58 = in_R8B & 1;
  std::tuple<int,_int>::tuple<int,_int,_true>((tuple<int,_int> *)&local_68,&local_38);
  util::
  cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::
  get<cornelich::vanilla_index::index_for(int,int,bool)::__0&>
            ((cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>
              *)this,(tuple<int,_int> *)(lVar1 + 0x10),&local_68);
  std::lock_guard<cornelich::util::spin_lock>::~lock_guard
            ((lock_guard<cornelich::util::spin_lock> *)&key);
  rVar2.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  rVar2.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (region_ptr)rVar2.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

region_ptr vanilla_index::index_for(std::int32_t cycle, std::int32_t file_number, bool append)
{
    std::lock_guard<mutex_t> lk(m_lock);
    auto key = std::make_pair(cycle, file_number);
    auto && creator = [this, append](const key_t & k)
    {
        auto cycle_ = std::get<0>(k);
        auto file_number_ = std::get<1>(k);
        auto && path = make_file(m_settings.path(),
                                 m_settings.cycle_format().date_from_cycle(cycle_),
                                 (util::streamer() << INDEX_FILE_NAME_PREFIX << file_number_).str(),
                                 append);
        return !path.empty()
                ? std::make_shared<region>(path, 1LL << m_index_block_size_bits, file_number_)
                : region_ptr();
    };

    return m_cache.get(key, creator);
}